

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O2

char * utf8_decode(char *o,int *val)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  char *pcVar4;
  uint *puVar5;
  int count;
  ulong uVar6;
  uint uVar7;
  
  bVar2 = *o;
  uVar3 = (uint)bVar2;
  uVar7 = (uint)bVar2;
  if ((char)bVar2 < '\0') {
    puVar5 = utf8_decode::limits;
    pcVar4 = (char *)0x0;
    bVar2 = 0;
    uVar6 = 0;
    uVar7 = 0;
    do {
      if ((uVar3 & 0x40) == 0) {
        if (3 < uVar6) {
          return (char *)0x0;
        }
        uVar7 = (uVar3 & 0x3f) << (bVar2 & 0x1f) | uVar7;
        if (0x10ffff < uVar7) {
          return (char *)0x0;
        }
        if (uVar7 <= *puVar5) {
          return (char *)0x0;
        }
        o = o + uVar6;
        goto LAB_0012b73f;
      }
      lVar1 = uVar6 + 1;
      uVar6 = uVar6 + 1;
      uVar7 = uVar7 << 6 | (byte)o[lVar1] & 0x3f;
      uVar3 = uVar3 * 2;
      puVar5 = puVar5 + 1;
      bVar2 = bVar2 + 5;
    } while ((o[lVar1] & 0xc0U) == 0x80);
  }
  else {
LAB_0012b73f:
    if (val != (int *)0x0) {
      *val = uVar7;
    }
    pcVar4 = o + 1;
  }
  return pcVar4;
}

Assistant:

static const char *utf8_decode (const char *s, utfint *val, int strict) {
  static const utfint limits[] =
        {~(utfint)0, 0x80, 0x800, 0x10000u, 0x200000u, 0x4000000u};
  unsigned int c = (unsigned char)s[0];
  utfint res = 0;  /* final result */
  if (c < 0x80)  /* ascii? */
    res = c;
  else {
    int count = 0;  /* to count number of continuation bytes */
    for (; c & 0x40; c <<= 1) {  /* while it needs continuation bytes... */
      unsigned int cc = (unsigned char)s[++count];  /* read next byte */
      if ((cc & 0xC0) != 0x80)  /* not a continuation byte? */
        return NULL;  /* invalid byte sequence */
      res = (res << 6) | (cc & 0x3F);  /* add lower 6 bits from cont. byte */
    }
    res |= ((utfint)(c & 0x7F) << (count * 5));  /* add first byte */
    if (count > 5 || res > MAXUTF || res < limits[count])
      return NULL;  /* invalid byte sequence */
    s += count;  /* skip continuation bytes read */
  }
  if (strict) {
    /* check for invalid code points; too large or surrogates */
    if (res > MAXUNICODE || (0xD800u <= res && res <= 0xDFFFu))
      return NULL;
  }
  if (val) *val = res;
  return s + 1;  /* +1 to include first byte */
}